

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall server_response::add_waiting_task_id(server_response *this,int id_task)

{
  common_log *log;
  size_type sVar1;
  uint in_ESI;
  unique_lock<std::mutex> lock;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  unique_lock<std::mutex> *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  *in_stack_ffffffffffffffa0;
  
  if (0 < common_log_verbosity_thold) {
    log = common_log_main();
    sVar1 = httplib::detail::std::
            unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::size
                      ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                        *)0x259587);
    in_stack_ffffffffffffff88 = (undefined4)sVar1;
    common_log_add(log,GGML_LOG_LEVEL_DEBUG,
                   "srv  %12.*s: add task %d to waiting list. current waiting = %d (before add)\n",
                   0xc,"add_waiting_task_id",(ulong)in_ESI);
  }
  httplib::detail::std::unique_lock<std::mutex>::unique_lock
            (in_stack_ffffffffffffff90,
             (mutex_type *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  httplib::detail::std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  ::insert(in_stack_ffffffffffffffa0,
           (value_type *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  httplib::detail::std::unique_lock<std::mutex>::~unique_lock(in_stack_ffffffffffffff90);
  return;
}

Assistant:

void add_waiting_task_id(int id_task) {
        SRV_DBG("add task %d to waiting list. current waiting = %d (before add)\n", id_task, (int) waiting_task_ids.size());

        std::unique_lock<std::mutex> lock(mutex_results);
        waiting_task_ids.insert(id_task);
    }